

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jp2.c
# Opt level: O1

opj_jp2_t * opj_jp2_create(OPJ_BOOL p_is_decoder)

{
  opj_jp2_t *jp2;
  opj_j2k_t *poVar1;
  opj_procedure_list_t *poVar2;
  
  jp2 = (opj_jp2_t *)opj_calloc(1,0xb0);
  if (jp2 != (opj_jp2_t *)0x0) {
    if (p_is_decoder == 0) {
      poVar1 = opj_j2k_create_compress();
    }
    else {
      poVar1 = opj_j2k_create_decompress();
    }
    jp2->j2k = poVar1;
    if (poVar1 != (opj_j2k_t *)0x0) {
      (jp2->color).icc_profile_buf = (OPJ_BYTE *)0x0;
      (jp2->color).icc_profile_len = 0;
      (jp2->color).jp2_cdef = (opj_jp2_cdef_t *)0x0;
      (jp2->color).jp2_pclr = (opj_jp2_pclr_t *)0x0;
      (jp2->color).jp2_has_colr = '\0';
      poVar2 = opj_procedure_list_create();
      jp2->m_validation_list = poVar2;
      if (poVar2 != (opj_procedure_list_t *)0x0) {
        poVar2 = opj_procedure_list_create();
        jp2->m_procedure_list = poVar2;
        if (poVar2 != (opj_procedure_list_t *)0x0) {
          return jp2;
        }
      }
    }
    opj_jp2_destroy(jp2);
    jp2 = (opj_jp2_t *)0x0;
  }
  return jp2;
}

Assistant:

opj_jp2_t* opj_jp2_create(OPJ_BOOL p_is_decoder)
{
    opj_jp2_t *jp2 = (opj_jp2_t*)opj_calloc(1, sizeof(opj_jp2_t));
    if (jp2) {

        /* create the J2K codec */
        if (! p_is_decoder) {
            jp2->j2k = opj_j2k_create_compress();
        } else {
            jp2->j2k = opj_j2k_create_decompress();
        }

        if (jp2->j2k == 00) {
            opj_jp2_destroy(jp2);
            return 00;
        }

        /* Color structure */
        jp2->color.icc_profile_buf = NULL;
        jp2->color.icc_profile_len = 0;
        jp2->color.jp2_cdef = NULL;
        jp2->color.jp2_pclr = NULL;
        jp2->color.jp2_has_colr = 0;

        /* validation list creation */
        jp2->m_validation_list = opj_procedure_list_create();
        if (! jp2->m_validation_list) {
            opj_jp2_destroy(jp2);
            return 00;
        }

        /* execution list creation */
        jp2->m_procedure_list = opj_procedure_list_create();
        if (! jp2->m_procedure_list) {
            opj_jp2_destroy(jp2);
            return 00;
        }
    }

    return jp2;
}